

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O1

void __thiscall
Refal2::CLeftPartCompiler::CompileLeftPart
          (CLeftPartCompiler *this,CUnitList *leftPart,bool isRightDirection)

{
  CNodeType **ppCVar1;
  CVariables *this_00;
  int iVar2;
  CNodeType *pCVar3;
  bool bVar4;
  CNodeType *pCVar5;
  CNodeType **ppCVar6;
  CHole local_40;
  
  this->top = 2;
  CHole::CHole(&local_40,leftPart,0,1);
  CNodeList<Refal2::CHole>::Append(&this->holes,&local_40);
  CNodeList<Refal2::CUnit>::~CNodeList((CNodeList<Refal2::CUnit> *)&local_40);
  ppCVar1 = &(this->holes).first;
  this->lastUsedHole = (this->holes).first;
  this_00 = &(this->super_CFunctionCompilerBase).variables;
  do {
    pCVar5 = (this->holes).first;
    while (this->hole = pCVar5, pCVar5 != (CNodeType *)0x0) {
      pCVar3 = (pCVar5->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.first;
      if (((pCVar3 == (CNodeType *)0x0) ||
          (pCVar3 == (pCVar5->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.last)) ||
         (((pCVar3->super_CUnit).type & UT_Variable) == 0)) goto LAB_0011fb8a;
      iVar2 = (pCVar3->super_CUnit).field_1.variable;
      if (((long)iVar2 < 0) ||
         ((this->super_CFunctionCompilerBase).variables.variablesSize <= iVar2)) {
LAB_0011fbd8:
        __assert_fail("IsValidVariableIndex( variableIndex )",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/Variables.h"
                      ,0x7c,"const CVariable &Refal2::CVariables::GetVariable(TVariableIndex) const"
                     );
      }
      if (this_00->variables[iVar2].type - VT_V < 2) {
        bVar4 = CVariables::IsSet(this_00,iVar2);
        if (((bVar4) ||
            (pCVar3 = (this->hole->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.last,
            pCVar3 == (CNodeType *)0x0)) || (((pCVar3->super_CUnit).type & UT_Variable) == 0))
        goto LAB_0011fb8a;
        iVar2 = (pCVar3->super_CUnit).field_1.variable;
        if (((long)iVar2 < 0) ||
           ((this->super_CFunctionCompilerBase).variables.variablesSize <= iVar2))
        goto LAB_0011fbd8;
        if (1 < this_00->variables[iVar2].type - VT_V) goto LAB_0011fb8a;
        bVar4 = CVariables::IsSet(this_00,iVar2);
        if (bVar4) goto LAB_0011fb8a;
        ppCVar6 = &this->hole->next;
      }
      else {
LAB_0011fb8a:
        matchElement(this);
        ppCVar6 = ppCVar1;
      }
      pCVar5 = *ppCVar6;
    }
    pCVar5 = *ppCVar1;
    if (pCVar5 == (CNodeType *)0x0) {
      if (this->maxTableSize < this->top) {
        this->maxTableSize = this->top;
      }
      return;
    }
    this->hole = pCVar5;
    matchVE(this,isRightDirection);
  } while( true );
}

Assistant:

void CLeftPartCompiler::CompileLeftPart( CUnitList& leftPart,
	bool isRightDirection )
{
	top = 2;
	holes.Append( CHole( leftPart, 0 /* left */, 1 /* right */ ) );
	lastUsedHole = holes.GetFirst();

	while( true ) {
		hole = holes.GetFirst();

		while( hole != 0 ) {
			if( hole->GetFirst() != hole->GetLast()
				&& isFreeVE( hole->GetFirst() ) && isFreeVE( hole->GetLast() ) )
			{
				hole = hole->Next();
			} else {
				matchElement();
				hole = holes.GetFirst();
			}
		}

		if( holes.IsEmpty() ) {
			break;
		} else {
			hole = holes.GetFirst();
			matchVE( isRightDirection );
		}
	}

	if( top > maxTableSize ) {
		maxTableSize = top;
	}
}